

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O1

string * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
::edges_to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
          *this)

{
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *pSVar1;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *pSVar2;
  ostringstream stream;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pSVar1 = *(Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
             **)(this + 0x38);
  pSVar2 = this + 0x38;
  if (pSVar1 != pSVar2) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
      std::ostream::operator<<((ostream *)local_1a8,*(int *)(pSVar1 + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
      std::ostream::operator<<((ostream *)local_1a8,*(int *)(pSVar1 + 0x24));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"} ",2);
      if (pSVar1 != pSVar2) {
        pSVar1 = *(Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
                   **)pSVar1;
      }
    } while (pSVar1 != pSVar2);
  }
  std::ios::widen((char)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string edges_to_string() const {
    std::ostringstream stream;
    for (auto edge : edge_range())
      stream << "{" << (*this)[edge].first() << "," << (*this)[edge].second() << "} ";
    stream << std::endl;
    return stream.str();
  }